

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guardedTests.cpp
# Opt level: O0

void __thiscall
deferred_guarded_deferred_guarded_2_Test::~deferred_guarded_deferred_guarded_2_Test
          (deferred_guarded_deferred_guarded_2_Test *this)

{
  deferred_guarded_deferred_guarded_2_Test *this_local;
  
  ~deferred_guarded_deferred_guarded_2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(deferred_guarded, deferred_guarded_2)
{
    deferred_guarded<int, shared_mutex> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            data.modify_detach([](int& value) { ++value; });
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto fut =
                data.modify_async([](int& value) -> int { return ++value; });
            fut.wait();
        }
    });
    std::thread th3([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto fut = data.modify_async([](int& value) -> void { ++value; });
            fut.wait();
        }
    });

    std::thread th4([&data]() {
        int last_val = 0;
        while (last_val != 300000) {
            auto data_handle = data.lock_shared();
            EXPECT_TRUE(last_val <= *data_handle);
            last_val = *data_handle;
        }
    });

    th1.join();
    th2.join();
    th3.join();
    th4.join();

    auto data_handle = data.lock_shared();

    EXPECT_EQ(*data_handle, 300000);
}